

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QString * __thiscall
QStyleSheetStyleSelector::attributeValue
          (QStyleSheetStyleSelector *this,NodePtr node,AttributeSelector *aSelector)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  QWidget *pQVar5;
  QStyle *pQVar6;
  QString *this_00;
  QStyleSheetStyle *in_RCX;
  undefined8 *in_RDX;
  long *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QStyleSheetStyle *proxy;
  QWidget *w;
  int propertyIndex;
  QObject *obj;
  QHash<QString,_QString> *cache;
  QString *name;
  QString *valueStr;
  bool isNumber;
  QMetaProperty property;
  QString className;
  const_iterator cacheIt;
  QVariant value;
  undefined4 in_stack_fffffffffffffd98;
  CaseSensitivity in_stack_fffffffffffffd9c;
  QStyleSheetStyle *in_stack_fffffffffffffda0;
  QStyleSheetStyle *in_stack_fffffffffffffda8;
  QStyleSheetStyle *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  undefined8 *puVar9;
  QChar sep;
  QChar local_1b2 [28];
  byte local_179;
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined8 local_158;
  storage_type *local_150;
  undefined1 local_140 [24];
  QLatin1StringView local_128;
  QChar local_116;
  QChar local_114;
  QChar local_112;
  undefined8 local_110;
  storage_type *local_108;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  QLatin1StringView local_e0;
  piter local_a0;
  piter local_90;
  undefined8 *local_80;
  undefined8 *local_70;
  QVariant local_68;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  sep.ucs = (char16_t)((ulong)in_stack_fffffffffffffdb8 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = in_RDX;
  uVar3 = (**(code **)(*in_RSI + 0x38))(in_RSI,in_RDX);
  if ((uVar3 & 1) == 0) {
    local_80 = local_70;
    QHash<const_QObject_*,_QHash<QString,_QString>_>::operator[]
              ((QHash<const_QObject_*,_QHash<QString,_QString>_> *)in_stack_fffffffffffffdb0,
               (QObject **)in_stack_fffffffffffffda8);
    local_90.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_90.d = (Data<QHashPrivate::Node<QString,_QString>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_90 = (piter)QHash<QString,_QString>::constFind
                                ((QHash<QString,_QString> *)in_stack_fffffffffffffda0,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    local_a0 = (piter)QHash<QString,_QString>::constEnd
                                ((QHash<QString,_QString> *)in_stack_fffffffffffffda8);
    bVar1 = QHash<QString,_QString>::const_iterator::operator!=
                      ((const_iterator *)in_stack_fffffffffffffda8,
                       (const_iterator *)in_stack_fffffffffffffda0);
    if (bVar1) {
      QHash<QString,_QString>::const_iterator::value((const_iterator *)0x455663);
      QString::QString((QString *)in_stack_fffffffffffffda0,
                       (QString *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    }
    else {
      local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      ::QVariant::QVariant((QVariant *)0x4556be);
      (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x4556f0);
      pcVar4 = (char *)(**(code **)*local_70)();
      QString::toLatin1((QString *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      QByteArray::operator_cast_to_char_((QByteArray *)0x45572e);
      iVar2 = QMetaObject::indexOfProperty(pcVar4);
      QByteArray::~QByteArray((QByteArray *)0x45574c);
      if (iVar2 == -1) {
        puVar9 = local_70;
        QString::toLatin1((QString *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        sep.ucs = (char16_t)((ulong)puVar9 >> 0x30);
        QByteArray::operator_cast_to_char_((QByteArray *)0x45578b);
        QObject::property((char *)&local_48);
        ::QVariant::operator=
                  ((QVariant *)in_stack_fffffffffffffda8,(QVariant *)in_stack_fffffffffffffda0);
        ::QVariant::~QVariant(&local_48);
        QByteArray::~QByteArray((QByteArray *)0x4557cf);
        bVar1 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffda0);
        if (!bVar1) {
          in_stack_fffffffffffffdb0 = in_RCX;
          local_e0 = Qt::Literals::StringLiterals::operator____L1
                               ((char *)in_stack_fffffffffffffda8,(size_t)in_stack_fffffffffffffda0)
          ;
          bVar1 = ::operator==((QString *)in_stack_fffffffffffffda8,
                               (QLatin1StringView *)in_stack_fffffffffffffda0);
          if (bVar1) {
            local_f8 = &DAT_aaaaaaaaaaaaaaaa;
            local_f0 = &DAT_aaaaaaaaaaaaaaaa;
            local_e8 = &DAT_aaaaaaaaaaaaaaaa;
            (**(code **)*local_70)();
            local_110 = QMetaObject::className();
            QByteArrayView::QByteArrayView<const_char_*,_true>
                      ((QByteArrayView *)in_stack_fffffffffffffdb0,
                       (char **)in_stack_fffffffffffffda8);
            QVar7.m_data = local_108;
            QVar7.m_size = (qsizetype)&local_f8;
            QString::fromLatin1(QVar7);
            QChar::QChar<char16_t,_true>(&local_112,L':');
            bVar1 = QString::contains((QString *)in_stack_fffffffffffffda0,
                                      (QChar)(char16_t)((ulong)in_stack_fffffffffffffda8 >> 0x30),
                                      in_stack_fffffffffffffd9c);
            if (bVar1) {
              QChar::QChar<char16_t,_true>(&local_114,L':');
              QChar::QChar<char16_t,_true>(&local_116,L'-');
              QString::replace((QChar *)&local_f8,(QChar *)(ulong)(ushort)local_114.ucs,
                               (uint)(ushort)local_116.ucs);
            }
            QString::operator=(in_RDI,(QString *)&local_f8);
            QString::~QString((QString *)0x455940);
          }
          else {
            local_128 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)in_RCX,(size_t)in_stack_fffffffffffffda0);
            bVar1 = ::operator==((QString *)in_RCX,(QLatin1StringView *)in_stack_fffffffffffffda0);
            in_stack_fffffffffffffda8 = in_RCX;
            if (bVar1) {
              pQVar5 = qobject_cast<QWidget*>
                                 ((QObject *)
                                  CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
              if (pQVar5 == (QWidget *)0x0) {
                in_stack_fffffffffffffda0 = (QStyleSheetStyle *)0x0;
              }
              else {
                QWidget::style((QWidget *)
                               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
                in_stack_fffffffffffffda0 = qt_styleSheet((QStyle *)0x4559b7);
              }
              in_stack_fffffffffffffda8 = in_RCX;
              if (in_stack_fffffffffffffda0 != (QStyleSheetStyle *)0x0) {
                pQVar6 = QStyleSheetStyle::baseStyle(in_RCX);
                (*(code *)**(undefined8 **)pQVar6)();
                local_158 = QMetaObject::className();
                QByteArrayView::QByteArrayView<const_char_*,_true>
                          ((QByteArrayView *)in_stack_fffffffffffffdb0,(char **)in_RCX);
                QVar8.m_data = local_150;
                QVar8.m_size = (qsizetype)local_140;
                QString::fromLatin1(QVar8);
                QString::operator=((QString *)in_stack_fffffffffffffda0,
                                   (QString *)
                                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
                QString::~QString((QString *)0x455a4c);
                in_stack_fffffffffffffda8 = in_RCX;
              }
            }
          }
        }
      }
      else {
        local_178 = &DAT_aaaaaaaaaaaaaaaa;
        local_170 = &DAT_aaaaaaaaaaaaaaaa;
        local_168 = &DAT_aaaaaaaaaaaaaaaa;
        local_160 = &DAT_aaaaaaaaaaaaaaaa;
        (**(code **)*local_70)();
        QMetaObject::property((int)&local_178);
        QMetaProperty::read((QObject *)&local_68);
        ::QVariant::operator=
                  ((QVariant *)in_stack_fffffffffffffda8,(QVariant *)in_stack_fffffffffffffda0);
        ::QVariant::~QVariant(&local_68);
        uVar3 = QMetaProperty::isEnumType();
        if ((uVar3 & 1) != 0) {
          local_179 = 0xaa;
          QString::toInt((QString *)in_stack_fffffffffffffda8,(bool *)in_stack_fffffffffffffda0,
                         in_stack_fffffffffffffd9c);
          if ((local_179 & 1) != 0) {
            QMetaType::fromType<int>();
            ::QVariant::convert((QMetaType *)local_28.data);
          }
        }
      }
      bVar1 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffda0);
      if (bVar1) {
        iVar2 = ::QVariant::userType((QVariant *)0x455b73);
        bVar1 = false;
        if ((iVar2 == 0xb) || (iVar2 = ::QVariant::userType((QVariant *)0x455b8a), iVar2 == 9)) {
          ::QVariant::toStringList();
          bVar1 = true;
          QChar::QChar<char16_t,_true>(local_1b2,L' ');
          QListSpecialMethods<QString>::join
                    ((QListSpecialMethods<QString> *)in_stack_fffffffffffffda8,sep);
        }
        else {
          ::QVariant::toString();
        }
        QString::operator=((QString *)in_stack_fffffffffffffda0,
                           (QString *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98))
        ;
        QString::~QString((QString *)0x455c0e);
        if (bVar1) {
          QList<QString>::~QList((QList<QString> *)0x455c24);
        }
      }
      this_00 = QHash<QString,_QString>::operator[]
                          ((QHash<QString,_QString> *)in_stack_fffffffffffffdb0,
                           (QString *)in_stack_fffffffffffffda8);
      QString::operator=(this_00,(QString *)in_RDI);
      ::QVariant::~QVariant((QVariant *)&local_28);
    }
  }
  else {
    QString::QString((QString *)0x455574);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString attributeValue(NodePtr node, const QCss::AttributeSelector& aSelector) const override
    {
        if (isNullNode(node))
            return QString();

        const QString &name = aSelector.name;
        QHash<QString, QString> &cache = m_attributeCache[OBJECT_PTR(node)];
        QHash<QString, QString>::const_iterator cacheIt = cache.constFind(name);
        if (cacheIt != cache.constEnd())
            return cacheIt.value();

        QVariant value;
        QString valueStr;
        QObject *obj = OBJECT_PTR(node);
        const int propertyIndex = obj->metaObject()->indexOfProperty(name.toLatin1());
        if (propertyIndex == -1) {
            value = obj->property(name.toLatin1()); // might be a dynamic property
            if (!value.isValid()) {
                if (name == "class"_L1) {
                    QString className = QString::fromLatin1(obj->metaObject()->className());
                    if (className.contains(u':'))
                        className.replace(u':', u'-');
                    valueStr = className;
                } else if (name == "style"_L1) {
                    QWidget *w = qobject_cast<QWidget *>(obj);
                    QStyleSheetStyle *proxy = w ? qt_styleSheet(w->style()) : nullptr;
                    if (proxy)
                        valueStr = QString::fromLatin1(proxy->baseStyle()->metaObject()->className());
                }
            }
        } else {
            const QMetaProperty property = obj->metaObject()->property(propertyIndex);
            value = property.read(obj);
            // support Qt 5 selector syntax, which required the integer enum value
            if (property.isEnumType()) {
                bool isNumber;
                aSelector.value.toInt(&isNumber);
                if (isNumber)
                    value.convert(QMetaType::fromType<int>());
            }
        }
        if (value.isValid()) {
            valueStr = (value.userType() == QMetaType::QStringList
                        || value.userType() == QMetaType::QVariantList)
                        ? value.toStringList().join(u' ')
                        : value.toString();
        }
        cache[name] = valueStr;
        return valueStr;
    }